

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O2

int __thiscall zmq::msg_t::move(msg_t *this,msg_t *src_)

{
  metadata_t *pmVar1;
  content_t *pcVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  int *piVar9;
  
  if ((byte)((src_->_u).base.type + 0x9b) < 7) {
    iVar8 = close(this,(int)src_);
    if (-1 < iVar8) {
      pmVar1 = (src_->_u).base.metadata;
      pcVar2 = (src_->_u).lmsg.content;
      sVar3 = (src_->_u).cmsg.size;
      uVar4 = *(undefined8 *)((long)&src_->_u + 0x18);
      uVar5 = *(undefined8 *)((long)&src_->_u + 0x20);
      uVar6 = *(undefined8 *)((long)&src_->_u + 0x28);
      uVar7 = *(undefined8 *)((long)&src_->_u + 0x38);
      *(undefined8 *)((long)&this->_u + 0x30) = *(undefined8 *)((long)&src_->_u + 0x30);
      *(undefined8 *)((long)&this->_u + 0x38) = uVar7;
      *(undefined8 *)((long)&this->_u + 0x20) = uVar5;
      *(undefined8 *)((long)&this->_u + 0x28) = uVar6;
      (this->_u).cmsg.size = sVar3;
      *(undefined8 *)((long)&this->_u + 0x18) = uVar4;
      (this->_u).base.metadata = pmVar1;
      (this->_u).lmsg.content = pcVar2;
      (src_->_u).base.metadata = (metadata_t *)0x0;
      *(undefined2 *)((long)&src_->_u + 0x29) = 0x6500;
      *(undefined4 *)((long)&src_->_u + 0x2b) = 0;
      *(undefined4 *)((long)&(src_->_u).base.routing_id + 2) = 0;
      return 0;
    }
  }
  else {
    piVar9 = __errno_location();
    *piVar9 = 0xe;
  }
  return -1;
}

Assistant:

bool zmq::msg_t::check () const
{
    return _u.base.type >= type_min && _u.base.type <= type_max;
}